

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

void __thiscall QCompleter::setModel(QCompleter *this,QAbstractItemModel *model)

{
  long lVar1;
  long *plVar2;
  QAbstractItemView *popup;
  QAbstractItemModel *pQVar3;
  long lVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  pQVar3 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel();
  if (pQVar3 != model) {
    lVar4 = QMetaObject::cast((QObject *)&QFileSystemModel::staticMetaObject);
    if (lVar4 != 0) {
      setCompletionRole(this,2);
    }
    plVar2 = *(long **)(lVar1 + 0x88);
    (**(code **)(*plVar2 + 0x188))(plVar2,model);
    popup = *(QAbstractItemView **)(lVar1 + 0x90);
    if (popup != (QAbstractItemView *)0x0) {
      setPopup(this,popup);
    }
    if ((pQVar3 != (QAbstractItemModel *)0x0) &&
       (*(QCompleter **)(*(long *)(pQVar3 + 8) + 0x10) == this)) {
      (**(code **)(*(long *)pQVar3 + 0x20))(pQVar3);
    }
    pcVar5 = (char *)QMetaObject::cast((QObject *)&QFileSystemModel::staticMetaObject);
    if (pcVar5 != (char *)0x0) {
      setCaseSensitivity(this,CaseSensitive);
      setCompletionRole(this,0x102);
      QObject::connect(local_30,pcVar5,(QObject *)"2directoryLoaded(QString)",(char *)this,0x6f73ae)
      ;
      QMetaObject::Connection::~Connection((Connection *)local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleter::setModel(QAbstractItemModel *model)
{
    Q_D(QCompleter);
    QAbstractItemModel *oldModel = d->proxy->sourceModel();
    if (oldModel == model)
        return;
#if QT_CONFIG(filesystemmodel)
    if (qobject_cast<const QFileSystemModel *>(oldModel))
        setCompletionRole(Qt::EditRole); // QTBUG-54642, clear FileNameRole set by QFileSystemModel
#endif
    d->proxy->setSourceModel(model);
    if (d->popup)
        setPopup(d->popup); // set the model and make new connections
    if (oldModel && oldModel->QObject::parent() == this)
        delete oldModel;
#if QT_CONFIG(filesystemmodel)
    QFileSystemModel *fsModel = qobject_cast<QFileSystemModel *>(model);
    if (fsModel) {
#if defined(Q_OS_WIN)
        setCaseSensitivity(Qt::CaseInsensitive);
#else
        setCaseSensitivity(Qt::CaseSensitive);
#endif
        setCompletionRole(QFileSystemModel::FileNameRole);
        connect(fsModel, SIGNAL(directoryLoaded(QString)), this, SLOT(_q_fileSystemModelDirectoryLoaded(QString)));
    }
#endif // QT_CONFIG(filesystemmodel)
}